

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void asmjit::v1_14::CodeHolder_resetInternal(CodeHolder *self,ResetPolicy resetPolicy)

{
  uint uVar1;
  Section *pSVar2;
  uint8_t *__ptr;
  BaseEmitter **ppBVar3;
  Section **ppSVar4;
  ulong i;
  size_t i_00;
  unsigned_long local_38;
  
  i = (ulong)*(uint *)&self->field_0xd0;
  while (i = i - 1, i != 0xffffffffffffffff) {
    ppBVar3 = ZoneVector<asmjit::v1_14::BaseEmitter_*>::operator[](&self->_emitters,i);
    CodeHolder::detach(self,*ppBVar3);
  }
  (self->_environment)._arch = kUnknown;
  (self->_environment)._subArch = kHost;
  (self->_environment)._vendor = kHost;
  (self->_environment)._platform = kUnknown;
  (self->_environment)._platformABI = kUnknown;
  (self->_environment)._objectFormat = kUnknown;
  (self->_environment)._floatABI = kHardFloat;
  (self->_environment)._reserved = '\0';
  local_38 = 0;
  Support::Array<unsigned_long,_4UL>::fill
            ((Array<unsigned_long,_4UL> *)&self->_cpuFeatures,&local_38);
  self->_baseAddress = 0xffffffffffffffff;
  self->_logger = (Logger *)0x0;
  self->_errorHandler = (ErrorHandler *)0x0;
  uVar1 = *(uint *)&self->field_0xe0;
  for (i_00 = 0; uVar1 != i_00; i_00 = i_00 + 1) {
    ppSVar4 = ZoneVector<asmjit::v1_14::Section_*>::operator[](&self->_sections,i_00);
    pSVar2 = *ppSVar4;
    __ptr = (pSVar2->_buffer)._data;
    if ((__ptr != (uint8_t *)0x0) && (((pSVar2->_buffer)._flags & kIsExternal) == kNone)) {
      free(__ptr);
    }
    (pSVar2->_buffer)._data = (uint8_t *)0x0;
    (pSVar2->_buffer)._capacity = 0;
  }
  *(undefined8 *)&self->_emitters = 0;
  *(undefined8 *)&self->field_0xd0 = 0;
  ZoneHashBase::reset((ZoneHashBase *)&self->_namedLabels);
  *(undefined8 *)&self->_relocations = 0;
  *(undefined8 *)&self->field_0x110 = 0;
  *(undefined8 *)&self->_labelEntries = 0;
  *(undefined8 *)&self->field_0x100 = 0;
  *(undefined8 *)&self->_sectionsByOrder = 0;
  *(undefined8 *)&self->field_0xf0 = 0;
  *(undefined8 *)&self->_sections = 0;
  *(undefined8 *)&self->field_0xe0 = 0;
  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = (Section *)0x0;
  *(undefined8 *)&self->_addressTableEntries = 0;
  ZoneAllocator::reset(&self->_allocator,&self->_zone);
  Zone::reset(&self->_zone,resetPolicy);
  return;
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, ResetPolicy resetPolicy) noexcept {
  uint32_t i;
  const ZoneVector<BaseEmitter*>& emitters = self->emitters();

  i = emitters.size();
  while (i)
    self->detach(emitters[--i]);

  // Reset everything into its construction state.
  self->_environment.reset();
  self->_cpuFeatures.reset();
  self->_baseAddress = Globals::kNoBaseAddress;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  // Reset all sections.
  uint32_t numSections = self->_sections.size();
  for (i = 0; i < numSections; i++) {
    Section* section = self->_sections[i];
    if (section->_buffer.data() && !section->_buffer.isExternal())
      ::free(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneAllocator* allocator = self->allocator();

  self->_emitters.reset();
  self->_namedLabels.reset();
  self->_relocations.reset();
  self->_labelEntries.reset();
  self->_sections.reset();
  self->_sectionsByOrder.reset();

  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = nullptr;
  self->_addressTableEntries.reset();

  allocator->reset(&self->_zone);
  self->_zone.reset(resetPolicy);
}